

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O0

_Bool array_array_container_inplace_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  long lVar1;
  long lVar2;
  int32_t min;
  array_container_t *paVar3;
  size_t sVar4;
  bitset_container_t *pbVar5;
  uint64_t uVar6;
  array_container_t *in_RDX;
  int *in_RSI;
  uint64_t *in_RDI;
  size_t unaff_retaddr;
  bitset_container_t *ourbitset;
  _Bool returnval;
  size_t in_stack_00000010;
  int totalCardinality;
  undefined4 in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffcc;
  array_container_t *in_stack_ffffffffffffffd0;
  uint64_t *words;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar7;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var8;
  
  min = (int)*in_RDI + *in_RSI;
  in_RDX->cardinality = 0;
  in_RDX->capacity = 0;
  if (min < 0x1001) {
    if (*(int *)((long)in_RDI + 4) < min) {
      paVar3 = array_container_create_given_capacity(in_stack_ffffffffffffffcc);
      *(array_container_t **)in_RDX = paVar3;
      lVar1._0_4_ = in_RDX->cardinality;
      lVar1._4_4_ = in_RDX->capacity;
      if (lVar1 == 0) {
        _Var8 = true;
      }
      else {
        array_container_union
                  (in_RDX,(array_container_t *)
                          CONCAT26((short)((uint)min >> 0x10),
                                   CONCAT24((short)min,in_stack_ffffffffffffffd8)),
                   in_stack_ffffffffffffffd0);
        _Var8 = false;
      }
    }
    else {
      memmove((void *)(in_RDI[1] + (long)*in_RSI * 2),(void *)in_RDI[1],(long)(int)*in_RDI << 1);
      sVar4 = union_uint16((uint16_t *)dst,in_stack_00000010,(uint16_t *)ourbitset,unaff_retaddr,
                           (uint16_t *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                          );
      *(int *)in_RDI = (int)sVar4;
      _Var8 = false;
    }
  }
  else {
    pbVar5 = bitset_container_create();
    *(bitset_container_t **)in_RDX = pbVar5;
    uVar7 = CONCAT13(1,(int3)in_stack_ffffffffffffffd8);
    lVar2._0_4_ = in_RDX->cardinality;
    lVar2._4_4_ = in_RDX->capacity;
    if (lVar2 != 0) {
      words = *(uint64_t **)in_RDX;
      bitset_set_list(words,(uint16_t *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0x1648bc);
      uVar6 = bitset_set_list_withcard
                        ((uint64_t *)CONCAT26((short)((uint)min >> 0x10),CONCAT24((short)min,uVar7))
                         ,(uint64_t)words,
                         (uint16_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         0x1648e3);
      *(int *)words = (int)uVar6;
      if ((int)*words < 0x1001) {
        if (*(int *)((long)in_RDI + 4) < (int)*words) {
          array_container_grow(in_RDX,min,SUB41((uint)uVar7 >> 0x18,0));
        }
        bitset_extract_setbits_uint16
                  (in_RDI,(size_t)in_RSI,(uint16_t *)in_RDX,(uint16_t)((uint)min >> 0x10));
        *(int *)in_RDI = (int)*words;
        *(uint64_t **)in_RDX = in_RDI;
        bitset_container_free((bitset_container_t *)0x164960);
        uVar7 = 0;
      }
    }
    _Var8 = (_Bool)((byte)((uint)uVar7 >> 0x18) & 1);
  }
  return _Var8;
}

Assistant:

bool array_array_container_inplace_union(array_container_t *src_1,
                                         const array_container_t *src_2,
                                         container_t **dst) {
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    *dst = NULL;
    if (totalCardinality <= DEFAULT_MAX_SIZE) {
        if (src_1->capacity < totalCardinality) {
            *dst = array_container_create_given_capacity(
                2 * totalCardinality);  // be purposefully generous
            if (*dst != NULL) {
                array_container_union(src_1, src_2, CAST_array(*dst));
            } else {
                return true;  // otherwise failure won't be caught
            }
            return false;  // not a bitset
        } else {
            memmove(src_1->array + src_2->cardinality, src_1->array,
                    src_1->cardinality * sizeof(uint16_t));
            // In theory, we could use fast_union_uint16, but it is unsafe. It
            // fails with Intel compilers in particular.
            // https://github.com/RoaringBitmap/CRoaring/pull/452
            // See report https://github.com/RoaringBitmap/CRoaring/issues/476
            src_1->cardinality = (int32_t)union_uint16(
                src_1->array + src_2->cardinality, src_1->cardinality,
                src_2->array, src_2->cardinality, src_1->array);
            return false;  // not a bitset
        }
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        ourbitset->cardinality = (int32_t)bitset_set_list_withcard(
            ourbitset->words, src_1->cardinality, src_2->array,
            src_2->cardinality);
        if (ourbitset->cardinality <= DEFAULT_MAX_SIZE) {
            // need to convert!
            if (src_1->capacity < ourbitset->cardinality) {
                array_container_grow(src_1, ourbitset->cardinality, false);
            }

            bitset_extract_setbits_uint16(ourbitset->words,
                                          BITSET_CONTAINER_SIZE_IN_WORDS,
                                          src_1->array, 0);
            src_1->cardinality = ourbitset->cardinality;
            *dst = src_1;
            bitset_container_free(ourbitset);
            returnval = false;  // not going to be a bitset
        }
    }
    return returnval;
}